

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  byte bVar1;
  uint uVar2;
  uchar uVar3;
  int iVar4;
  uchar *puVar5;
  void *__src;
  long lVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  uchar *puVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  size_t sVar17;
  uchar *puVar18;
  int iVar19;
  int *piVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  int data_len;
  bool bVar25;
  int zlen;
  int local_d0;
  int local_c4;
  int local_34;
  
  uVar24 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar24;
  }
  data_len = (uVar24 + 1) * y;
  puVar5 = (uchar *)malloc((long)data_len);
  if (puVar5 != (uchar *)0x0) {
    sVar17 = (size_t)(int)uVar24;
    __src = malloc(sVar17);
    if (__src == (void *)0x0) {
      free(puVar5);
    }
    else {
      lVar6 = (long)n;
      if (0 < y) {
        lVar9 = (long)stride_bytes;
        lVar12 = (long)pixels - lVar9;
        puVar18 = pixels + lVar6;
        puVar10 = pixels + (lVar6 - lVar9);
        uVar21 = 0;
        do {
          piVar20 = stbi_write_png_to_mem::mapping;
          if (uVar21 == 0) {
            piVar20 = stbi_write_png_to_mem::firstmap;
          }
          local_c4 = 0x7fffffff;
          local_d0 = 0;
          iVar19 = 0;
          do {
            iVar4 = local_d0;
            if (iVar19 == 0) {
              iVar4 = 0;
            }
            if (iVar4 < 5) {
              lVar7 = (long)iVar4;
              do {
                iVar4 = piVar20[lVar7];
                if (0 < n) {
                  uVar22 = 0;
                  do {
                    switch(iVar4) {
                    case 0:
                    case 1:
                    case 5:
                    case 6:
                      uVar3 = pixels[uVar22];
                      break;
                    case 2:
                    case 4:
                      uVar3 = pixels[uVar22] - *(char *)(lVar12 + uVar22);
                      break;
                    case 3:
                      uVar3 = pixels[uVar22] - (*(byte *)(lVar12 + uVar22) >> 1);
                      break;
                    default:
                      goto switchD_001b8295_default;
                    }
                    *(uchar *)((long)__src + uVar22) = uVar3;
switchD_001b8295_default:
                    uVar22 = uVar22 + 1;
                  } while ((uint)n != uVar22);
                }
                if (n < (int)uVar24) {
                  lVar23 = 0;
                  do {
                    switch(iVar4) {
                    case 0:
                      uVar3 = puVar18[lVar23];
                      break;
                    case 1:
                    case 6:
                      uVar3 = puVar18[lVar23] - pixels[lVar23];
                      break;
                    case 2:
                      uVar3 = puVar18[lVar23] - puVar10[lVar23];
                      break;
                    case 3:
                      uVar3 = puVar18[lVar23] -
                              (char)((uint)puVar10[lVar23] + (uint)pixels[lVar23] >> 1);
                      break;
                    case 4:
                      bVar13 = pixels[lVar23];
                      bVar1 = puVar10[lVar23];
                      bVar8 = *(byte *)(lVar12 + lVar23);
                      iVar15 = ((uint)bVar1 + (uint)bVar13) - (uint)bVar8;
                      uVar14 = iVar15 - (uint)bVar13;
                      uVar2 = -uVar14;
                      if (0 < (int)uVar14) {
                        uVar2 = uVar14;
                      }
                      uVar11 = iVar15 - (uint)bVar1;
                      uVar14 = -uVar11;
                      if (0 < (int)uVar11) {
                        uVar14 = uVar11;
                      }
                      uVar16 = iVar15 - (uint)bVar8;
                      uVar11 = -uVar16;
                      if (0 < (int)uVar16) {
                        uVar11 = uVar16;
                      }
                      if (uVar14 <= uVar11) {
                        bVar8 = bVar1;
                      }
                      if (uVar11 < uVar2) {
                        bVar13 = bVar8;
                      }
                      if (uVar14 < uVar2) {
                        bVar13 = bVar8;
                      }
                      uVar3 = puVar18[lVar23] - bVar13;
                      break;
                    case 5:
                      uVar3 = puVar18[lVar23] - (pixels[lVar23] >> 1);
                      break;
                    default:
                      goto switchD_001b82ee_default;
                    }
                    *(uchar *)((long)__src + lVar23 + lVar6) = uVar3;
switchD_001b82ee_default:
                    lVar23 = lVar23 + 1;
                  } while (sVar17 - lVar6 != lVar23);
                }
                if (iVar19 == 0) {
                  if ((int)uVar24 < 1) {
                    iVar4 = 0;
                  }
                  else {
                    uVar22 = 0;
                    iVar4 = 0;
                    do {
                      bVar13 = (char)*(byte *)((long)__src + uVar22) >> 7;
                      iVar4 = iVar4 + (uint)(byte)((*(byte *)((long)__src + uVar22) ^ bVar13) -
                                                  bVar13);
                      uVar22 = uVar22 + 1;
                    } while (uVar24 != uVar22);
                  }
                  if (iVar4 < local_c4) {
                    local_d0 = (int)lVar7;
                    local_c4 = iVar4;
                  }
                }
              } while ((iVar19 == 0) && (bVar25 = lVar7 < 4, lVar7 = lVar7 + 1, bVar25));
            }
            bVar25 = iVar19 == 0;
            iVar19 = iVar19 + 1;
          } while (bVar25);
          lVar7 = uVar21 * (long)(int)(uVar24 + 1);
          puVar5[lVar7] = (uchar)local_d0;
          memcpy(puVar5 + lVar7 + 1,__src,sVar17);
          uVar21 = uVar21 + 1;
          lVar12 = lVar12 + lVar9;
          pixels = pixels + lVar9;
          puVar18 = puVar18 + lVar9;
          puVar10 = puVar10 + lVar9;
        } while (uVar21 != (uint)y);
      }
      free(__src);
      puVar18 = stbi_zlib_compress(puVar5,data_len,&local_34,8);
      free(puVar5);
      sVar17 = (size_t)local_34;
      puVar5 = (uchar *)malloc(sVar17 + 0x39);
      if (puVar5 != (uchar *)0x0) {
        *out_len = (int)(sVar17 + 0x39);
        puVar5[0] = 0x89;
        puVar5[1] = 'P';
        puVar5[2] = 'N';
        puVar5[3] = 'G';
        puVar5[4] = '\r';
        puVar5[5] = '\n';
        puVar5[6] = '\x1a';
        puVar5[7] = '\n';
        puVar5[8] = '\0';
        puVar5[9] = '\0';
        puVar5[10] = '\0';
        puVar5[0xb] = '\r';
        puVar5[0xc] = 'I';
        puVar5[0xd] = 'H';
        puVar5[0xe] = 'D';
        puVar5[0xf] = 'R';
        puVar5[0x10] = (uchar)((uint)x >> 0x18);
        puVar5[0x11] = (uchar)((uint)x >> 0x10);
        puVar5[0x12] = (uchar)((uint)x >> 8);
        puVar5[0x13] = (uchar)x;
        puVar5[0x14] = (uchar)((uint)y >> 0x18);
        puVar5[0x15] = (uchar)((uint)y >> 0x10);
        puVar5[0x16] = (uchar)((uint)y >> 8);
        puVar5[0x17] = (uchar)y;
        puVar5[0x18] = '\b';
        puVar5[0x19] = (&DAT_001ce290)[lVar6 * 4];
        puVar5[0x1a] = '\0';
        puVar5[0x1b] = '\0';
        puVar5[0x1c] = '\0';
        uVar24 = stbiw__crc32(puVar5 + 0xc,0x11);
        puVar5[0x1d] = (uchar)(uVar24 >> 0x18);
        puVar5[0x1e] = (uchar)(uVar24 >> 0x10);
        puVar5[0x1f] = (uchar)(uVar24 >> 8);
        puVar5[0x20] = (uchar)uVar24;
        puVar5[0x21] = (uchar)((uint)local_34 >> 0x18);
        puVar5[0x22] = (uchar)((uint)local_34 >> 0x10);
        puVar5[0x23] = (uchar)((uint)local_34 >> 8);
        puVar5[0x24] = (uchar)local_34;
        puVar5[0x25] = 'I';
        puVar5[0x26] = 'D';
        puVar5[0x27] = 'A';
        puVar5[0x28] = 'T';
        memmove(puVar5 + 0x29,puVar18,sVar17);
        free(puVar18);
        uVar24 = stbiw__crc32(puVar5 + 0x25,local_34 + 4);
        puVar5[sVar17 + 0x29] = (uchar)(uVar24 >> 0x18);
        puVar5[sVar17 + 0x2a] = (uchar)(uVar24 >> 0x10);
        puVar5[sVar17 + 0x2b] = (uchar)(uVar24 >> 8);
        puVar5[sVar17 + 0x2c] = (uchar)uVar24;
        puVar18 = puVar5 + sVar17 + 0x2d;
        puVar18[0] = '\0';
        puVar18[1] = '\0';
        puVar18[2] = '\0';
        puVar18[3] = '\0';
        puVar18[4] = 'I';
        puVar18[5] = 'E';
        puVar18[6] = 'N';
        puVar18[7] = 'D';
        uVar24 = stbiw__crc32(puVar5 + sVar17 + 0x31,4);
        *(uint *)(puVar5 + sVar17 + 0x35) =
             uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
        if (puVar5 + sVar17 + 0x39 == puVar5 + *out_len) {
          return puVar5;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image_write/stb_image_write.h"
                      ,0x3a9,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = (unsigned char) ctype[n];
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}